

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool parser::operator==(Convolution *lhs,Convolution *rhs)

{
  bool bVar1;
  
  if (lhs->header == rhs->header) {
    bVar1 = std::operator==(&lhs->body,&rhs->body);
    return bVar1;
  }
  return false;
}

Assistant:

bool operator==(const Convolution& lhs, const Convolution& rhs) {
            return lhs.header == rhs.header &&
                   lhs.body == rhs.body;
        }